

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

ssh_keyalg * ec_alg_by_oid(int len,void *oid,ec_curve **curve)

{
  ssh_keyalg *psVar1;
  undefined8 *puVar2;
  int iVar3;
  ec_curve *peVar4;
  long lVar5;
  
  lVar5 = 0;
  while( true ) {
    psVar1 = *(ssh_keyalg **)((long)ec_alg_by_oid::algs_with_oid + lVar5);
    puVar2 = (undefined8 *)psVar1->extra;
    if ((*(int *)(puVar2 + 3) == len) && (iVar3 = bcmp(oid,(void *)puVar2[2],(long)len), iVar3 == 0)
       ) break;
    lVar5 = lVar5 + 8;
    if (lVar5 == 0x18) {
      return (ssh_keyalg *)0x0;
    }
  }
  peVar4 = (ec_curve *)(*(code *)*puVar2)();
  *curve = peVar4;
  return psVar1;
}

Assistant:

const ssh_keyalg *ec_alg_by_oid(int len, const void *oid,
                                        const struct ec_curve **curve)
{
    static const ssh_keyalg *algs_with_oid[] = {
        &ssh_ecdsa_nistp256,
        &ssh_ecdsa_nistp384,
        &ssh_ecdsa_nistp521,
    };
    int i;

    for (i = 0; i < lenof(algs_with_oid); i++) {
        const ssh_keyalg *alg = algs_with_oid[i];
        const struct ecsign_extra *extra =
            (const struct ecsign_extra *)alg->extra;
        if (len == extra->oidlen && !memcmp(oid, extra->oid, len)) {
            *curve = extra->curve();
            return alg;
        }
    }
    return NULL;
}